

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

int __thiscall
Fl_PostScript_File_Device::start_job
          (Fl_PostScript_File_Device *this,int pagecount,Page_Format format,Page_Layout layout)

{
  Fl_PostScript_Graphics_Driver *this_00;
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  int iVar4;
  Fl_Native_File_Chooser fnfc;
  Fl_Native_File_Chooser FStack_78;
  
  Fl_Native_File_Chooser::Fl_Native_File_Chooser(&FStack_78,0);
  Fl_Native_File_Chooser::title(&FStack_78,file_chooser_title);
  Fl_Native_File_Chooser::type(&FStack_78,4);
  Fl_Native_File_Chooser::options(&FStack_78,1);
  Fl_Native_File_Chooser::filter(&FStack_78,"PostScript\t*.ps\n");
  iVar1 = Fl_Native_File_Chooser::show(&FStack_78);
  iVar4 = 1;
  if (iVar1 == 0) {
    this_00 = (Fl_PostScript_Graphics_Driver *)
              (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver;
    pcVar2 = Fl_Native_File_Chooser::filename(&FStack_78);
    pFVar3 = fl_fopen(pcVar2,"w");
    this_00->output = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      iVar4 = 2;
    }
    else {
      pcVar2 = Fl_Native_File_Chooser::filename(&FStack_78);
      pcVar2 = strdup(pcVar2);
      this_00->ps_filename_ = pcVar2;
      Fl_PostScript_Graphics_Driver::start_postscript(this_00,pagecount,format,layout);
      iVar4 = 0;
      (*(this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device[3])
                (this);
    }
  }
  Fl_Native_File_Chooser::~Fl_Native_File_Chooser(&FStack_78);
  return iVar4;
}

Assistant:

int Fl_PostScript_File_Device::start_job (int pagecount, enum Fl_Paged_Device::Page_Format format, 
					  enum Fl_Paged_Device::Page_Layout layout)
{
  Fl_Native_File_Chooser fnfc;
  fnfc.title(Fl_PostScript_File_Device::file_chooser_title);
  fnfc.type(Fl_Native_File_Chooser::BROWSE_SAVE_FILE);
  fnfc.options(Fl_Native_File_Chooser::SAVEAS_CONFIRM);
  fnfc.filter("PostScript\t*.ps\n");
  // Show native chooser
  if ( fnfc.show() ) return 1;
  Fl_PostScript_Graphics_Driver *ps = driver();
  ps->output = fl_fopen(fnfc.filename(), "w");
  if(ps->output == NULL) return 2;
  ps->ps_filename_ = strdup(fnfc.filename());
  ps->start_postscript(pagecount, format, layout);
  this->set_current();
  return 0;
}